

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_function.hpp
# Opt level: O0

object boost::python::detail::
       make_function_aux<long(*)(),boost::python::default_call_policies,boost::mpl::vector1<long>>
                 (_func_long *f,default_call_policies *p,vector1<long> *param_3)

{
  undefined8 in_RSI;
  object_base in_RDI;
  caller<long_(*)(),_boost::python::default_call_policies,_boost::mpl::vector1<long>_>
  *in_stack_ffffffffffffffb8;
  py_function *in_stack_ffffffffffffffc0;
  caller<long_(*)(),_boost::python::default_call_policies,_boost::mpl::vector1<long>_> local_30;
  py_function local_28 [5];
  
  caller<long_(*)(),_boost::python::default_call_policies,_boost::mpl::vector1<long>_>::caller
            (&local_30,in_RSI);
  objects::py_function::
  py_function<boost::python::detail::caller<long(*)(),boost::python::default_call_policies,boost::mpl::vector1<long>>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  objects::function_object((objects *)in_RDI.m_ptr,local_28);
  objects::py_function::~py_function((py_function *)0x3a63e7);
  return (object)(object_base)in_RDI.m_ptr;
}

Assistant:

object make_function_aux(
      F f                               // An object that can be invoked by detail::invoke()
      , CallPolicies const& p           // CallPolicies to use in the invocation
      , Sig const&                      // An MPL sequence of argument types expected by F
      )
  {
      return objects::function_object(
          detail::caller<F,CallPolicies,Sig>(f, p)
      );
  }